

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

PHYSFS_sint64 zip_find_end_of_central_dir(PHYSFS_Io *io,PHYSFS_sint64 *len)

{
  ulong _len;
  int iVar1;
  int iVar2;
  ulong uVar3;
  PHYSFS_uint64 PVar4;
  ulong uVar5;
  ulong _len_00;
  size_t sVar6;
  undefined4 uVar7;
  undefined8 local_140;
  PHYSFS_uint8 buf [256];
  
  uVar3 = (*io->length)(io);
  if (uVar3 != 0xffffffffffffffff) {
    _len_00 = 0x100;
    PVar4 = uVar3 - 0x100;
    if (uVar3 < 0x100) {
      _len_00 = uVar3;
      PVar4 = 0;
    }
    _len = _len_00 - 4;
    local_140 = _len & 0xffffffff;
    uVar7._0_1_ = '\0';
    uVar7._1_1_ = '\0';
    uVar7._2_1_ = '\0';
    uVar7._3_1_ = '\0';
    sVar6 = 0;
    while ((iVar2 = (int)sVar6, iVar2 < 0x10015 && ((long)iVar2 < (long)uVar3))) {
      iVar1 = (*io->seek)(io,PVar4);
      if (iVar1 == 0) {
        return -1;
      }
      if (iVar2 == 0) {
        iVar2 = __PHYSFS_readAll(io,buf,_len_00);
        uVar5 = local_140;
        sVar6 = _len_00;
        if (iVar2 == 0) {
          return -1;
        }
      }
      else {
        iVar1 = __PHYSFS_readAll(io,buf,_len);
        if (iVar1 == 0) {
          return -1;
        }
        *(undefined4 *)(buf + (_len_00 - 4)) = uVar7;
        uVar5 = local_140;
        sVar6 = (ulong)(uint)(iVar2 + (int)_len);
      }
      for (; 0 < (int)(uint)uVar5; uVar5 = uVar5 - 1) {
        if ((((buf[uVar5] == 'P') && (buf[uVar5 + 1] == 'K')) && (buf[uVar5 + 2] == '\x05')) &&
           (buf[uVar5 + 3] == '\x06')) {
          if (len != (PHYSFS_sint64 *)0x0) {
            *len = uVar3;
          }
          return PVar4 + ((uint)uVar5 & 0x7fffffff);
        }
      }
      PVar4 = PVar4 - _len;
      uVar7 = buf._0_4_;
      if ((long)PVar4 < 1) {
        PVar4 = 0;
      }
    }
    PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
  }
  return -1;
}

Assistant:

static PHYSFS_sint64 zip_find_end_of_central_dir(PHYSFS_Io *io, PHYSFS_sint64 *len)
{
    PHYSFS_uint8 buf[256];
    PHYSFS_uint8 extra[4] = { 0, 0, 0, 0 };
    PHYSFS_sint32 i = 0;
    PHYSFS_sint64 filelen;
    PHYSFS_sint64 filepos;
    PHYSFS_sint32 maxread;
    PHYSFS_sint32 totalread = 0;
    int found = 0;

    filelen = io->length(io);
    BAIL_IF_ERRPASS(filelen == -1, -1);

    /*
     * Jump to the end of the file and start reading backwards.
     *  The last thing in the file is the zipfile comment, which is variable
     *  length, and the field that specifies its size is before it in the
     *  file (argh!)...this means that we need to scan backwards until we
     *  hit the end-of-central-dir signature. We can then sanity check that
     *  the comment was as big as it should be to make sure we're in the
     *  right place. The comment length field is 16 bits, so we can stop
     *  searching for that signature after a little more than 64k at most,
     *  and call it a corrupted zipfile.
     */

    if (sizeof (buf) < filelen)
    {
        filepos = filelen - sizeof (buf);
        maxread = sizeof (buf);
    } /* if */
    else
    {
        filepos = 0;
        maxread = (PHYSFS_uint32) filelen;
    } /* else */

    while ((totalread < filelen) && (totalread < 65557))
    {
        BAIL_IF_ERRPASS(!io->seek(io, filepos), -1);

        /* make sure we catch a signature between buffers. */
        if (totalread != 0)
        {
            if (!__PHYSFS_readAll(io, buf, maxread - 4))
                return -1;
            memcpy(&buf[maxread - 4], &extra, sizeof (extra));
            totalread += maxread - 4;
        } /* if */
        else
        {
            if (!__PHYSFS_readAll(io, buf, maxread))
                return -1;
            totalread += maxread;
        } /* else */

        memcpy(&extra, buf, sizeof (extra));

        for (i = maxread - 4; i > 0; i--)
        {
            if ((buf[i + 0] == 0x50) &&
                (buf[i + 1] == 0x4B) &&
                (buf[i + 2] == 0x05) &&
                (buf[i + 3] == 0x06) )
            {
                found = 1;  /* that's the signature! */
                break;  
            } /* if */
        } /* for */

        if (found)
            break;

        filepos -= (maxread - 4);
        if (filepos < 0)
            filepos = 0;
    } /* while */

    BAIL_IF(!found, PHYSFS_ERR_UNSUPPORTED, -1);

    if (len != NULL)
        *len = filelen;

    return (filepos + i);
}